

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseCommand(WastParser *this,Script *script,CommandPtr *out_command)

{
  TokenType TVar1;
  Result RVar2;
  CommandPtr *pCVar3;
  
  pCVar3 = (CommandPtr *)0x1;
  TVar1 = Peek(this,1);
  switch(TVar1) {
  case AssertException:
    RVar2 = ParseAssertExceptionCommand(this,out_command);
    return (Result)RVar2.enum_;
  case AssertExhaustion:
    RVar2 = ParseAssertExhaustionCommand(this,out_command);
    return (Result)RVar2.enum_;
  case AssertInvalid:
    RVar2 = ParseAssertInvalidCommand(this,out_command);
    return (Result)RVar2.enum_;
  case AssertMalformed:
    RVar2 = ParseAssertMalformedCommand(this,out_command);
    return (Result)RVar2.enum_;
  case AssertReturn:
    RVar2 = ParseAssertReturnCommand(this,out_command);
    return (Result)RVar2.enum_;
  case AssertTrap:
    RVar2 = ParseAssertTrapCommand(this,out_command);
    return (Result)RVar2.enum_;
  case AssertUnlinkable:
    RVar2 = ParseAssertUnlinkableCommand(this,out_command);
    return (Result)RVar2.enum_;
  }
  switch(TVar1) {
  case Get:
  case Invoke:
    RVar2 = ParseActionCommand(this,out_command);
    return (Result)RVar2.enum_;
  case Global:
  case Import:
  case Local:
  case Lpar:
  case Memory:
    goto switchD_0015aa6a_caseD_19;
  case Input:
    RVar2 = ParseInputCommand(this,pCVar3);
    return (Result)RVar2.enum_;
  case Module:
    RVar2 = ParseModuleCommand(this,script,out_command);
    return (Result)RVar2.enum_;
  default:
    if (TVar1 == Output) {
      RVar2 = ParseOutputCommand(this,pCVar3);
      return (Result)RVar2.enum_;
    }
    if (TVar1 == Register) {
      RVar2 = ParseRegisterCommand(this,out_command);
      return (Result)RVar2.enum_;
    }
switchD_0015aa6a_caseD_19:
    __assert_fail("!\"ParseCommand should only be called when IsCommand() is true\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                  ,0xd9c,"Result wabt::WastParser::ParseCommand(Script *, CommandPtr *)");
  }
}

Assistant:

Result WastParser::ParseCommand(Script* script, CommandPtr* out_command) {
  WABT_TRACE(ParseCommand);
  switch (Peek(1)) {
    case TokenType::AssertException:
      return ParseAssertExceptionCommand(out_command);

    case TokenType::AssertExhaustion:
      return ParseAssertExhaustionCommand(out_command);

    case TokenType::AssertInvalid:
      return ParseAssertInvalidCommand(out_command);

    case TokenType::AssertMalformed:
      return ParseAssertMalformedCommand(out_command);

    case TokenType::AssertReturn:
      return ParseAssertReturnCommand(out_command);

    case TokenType::AssertTrap:
      return ParseAssertTrapCommand(out_command);

    case TokenType::AssertUnlinkable:
      return ParseAssertUnlinkableCommand(out_command);

    case TokenType::Get:
    case TokenType::Invoke:
      return ParseActionCommand(out_command);

    case TokenType::Module:
      return ParseModuleCommand(script, out_command);

    case TokenType::Register:
      return ParseRegisterCommand(out_command);

    case TokenType::Input:
      return ParseInputCommand(out_command);

    case TokenType::Output:
      return ParseOutputCommand(out_command);

    default:
      assert(!"ParseCommand should only be called when IsCommand() is true");
      return Result::Error;
  }
}